

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
phmap::priv::
btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToWeakOrdering,_std::allocator<int>,_256,_false>_>
::delete_leaf_node(btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToWeakOrdering,_std::allocator<int>,_256,_false>_>
                   *this,node_type *node)

{
  node_type nVar1;
  
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToWeakOrdering,_std::allocator<int>,_256,_false>_>
  ::destroy(node,(allocator_type *)node);
  if (((ulong)node & 7) == 0) {
    nVar1 = (node_type)0x3d;
    if (node[0xb] != (node_type)0x0) {
      nVar1 = node[0xb];
    }
    Deallocate<8ul,std::allocator<int>>
              ((allocator<int> *)this,node,(ulong)((uint)(byte)nVar1 * 4 + 0x13 & 0xfffffff8));
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToWeakOrdering, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToWeakOrdering, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToWeakOrdering, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToWeakOrdering, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
               );
}

Assistant:

void delete_leaf_node(node_type *node) {
            node->destroy(mutable_allocator());
            deallocate(node_type::LeafSize(node->max_count()), node);
        }